

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O3

BUFFER_HANDLE
mqtt_codec_unsubscribe
          (uint16_t packetId,char **unsubscribeList,size_t count,STRING_HANDLE trace_log)

{
  char *__src;
  bool bVar1;
  int iVar2;
  BUFFER_HANDLE ctrlPacket;
  STRING_HANDLE handle;
  size_t sVar3;
  size_t __n;
  uchar *puVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((count != 0 && unsubscribeList != (char **)0x0) &&
     (ctrlPacket = BUFFER_new(), ctrlPacket != (BUFFER_HANDLE)0x0)) {
    iVar2 = constructSubscibeTypeVariableHeader(ctrlPacket,packetId);
    if (iVar2 == 0) {
      if (trace_log == (STRING_HANDLE)0x0) {
        handle = (STRING_HANDLE)0x0;
      }
      else {
        handle = STRING_construct_sprintf(" | PACKET_ID: %u",(ulong)packetId);
      }
      uVar5 = 1;
      do {
        sVar3 = BUFFER_length(ctrlPacket);
        __n = strlen(unsubscribeList[uVar5 - 1]);
        if ((__n < 0x10000) && (iVar2 = BUFFER_enlarge(ctrlPacket,__n + 2), iVar2 == 0)) {
          puVar4 = BUFFER_u_char(ctrlPacket);
          __src = unsubscribeList[uVar5 - 1];
          *(ushort *)(puVar4 + sVar3) = (ushort)__n << 8 | (ushort)__n >> 8;
          memcpy(puVar4 + sVar3 + 2,__src,__n);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (handle != (STRING_HANDLE)0x0) {
          STRING_sprintf(handle," | TOPIC_NAME: %s",unsubscribeList[uVar5 - 1]);
        }
        bVar6 = uVar5 < count;
        uVar5 = uVar5 + 1;
      } while ((bool)(bVar6 & bVar1));
      if (bVar1) {
        if (trace_log == (STRING_HANDLE)0x0) {
          iVar2 = constructFixedHeader(ctrlPacket,UNSUBSCRIBE_TYPE,'\x02');
          if (iVar2 == 0) goto LAB_00114f33;
        }
        else {
          STRING_copy(trace_log,"UNSUBSCRIBE");
          iVar2 = constructFixedHeader(ctrlPacket,UNSUBSCRIBE_TYPE,'\x02');
          if (iVar2 == 0) {
            STRING_concat_with_STRING(trace_log,handle);
            goto LAB_00114f33;
          }
        }
        BUFFER_delete(ctrlPacket);
        ctrlPacket = (BUFFER_HANDLE)0x0;
      }
      else {
        BUFFER_delete(ctrlPacket);
        ctrlPacket = (BUFFER_HANDLE)0x0;
      }
LAB_00114f33:
      if (handle == (STRING_HANDLE)0x0) {
        return ctrlPacket;
      }
      STRING_delete(handle);
      return ctrlPacket;
    }
    BUFFER_delete(ctrlPacket);
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE mqtt_codec_unsubscribe(uint16_t packetId, const char** unsubscribeList, size_t count, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_027: [If the parameters unsubscribeList is NULL or if count is 0 then mqtt_codec_unsubscribe shall return NULL.] */
    if (unsubscribeList == NULL || count == 0)
    {
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_030: [mqtt_codec_unsubscribe shall return a BUFFER_HANDLE that represents a MQTT SUBSCRIBE message.] */
        result = BUFFER_new();
        if (result != NULL)
        {
            if (constructSubscibeTypeVariableHeader(result, packetId) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_029: [If any error is encountered then mqtt_codec_unsubscribe shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                STRING_HANDLE unsub_trace = NULL;
                if (trace_log != NULL)
                {
                    unsub_trace = STRING_construct_sprintf(" | PACKET_ID: %"PRIu16, packetId);
                }
                /* Codes_SRS_MQTT_CODEC_07_028: [mqtt_codec_unsubscribe shall iterate through count items in the unsubscribeList.] */
                if (addListItemsToUnsubscribePacket(result, unsubscribeList, count, unsub_trace) != 0)
                {
                    /* Codes_SRS_MQTT_CODEC_07_029: [If any error is encountered then mqtt_codec_unsubscribe shall return NULL.] */
                    BUFFER_delete(result);
                    result = NULL;
                }
                else
                {
                    if (trace_log != NULL)
                    {
                        (void)STRING_copy(trace_log, "UNSUBSCRIBE");
                    }
                    if (constructFixedHeader(result, UNSUBSCRIBE_TYPE, UNSUBSCRIBE_FIXED_HEADER_FLAG) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_029: [If any error is encountered then mqtt_codec_unsubscribe shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, unsub_trace);
                        }
                    }
                }
                if (unsub_trace != NULL)
                {
                    STRING_delete(unsub_trace);
                }
            }
        }
    }
    return result;
}